

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolutiondepthwise_x86.cpp
# Opt level: O3

int __thiscall
ncnn::ConvolutionDepthWise_x86::create_pipeline(ConvolutionDepthWise_x86 *this,Option *opt)

{
  undefined4 uVar1;
  undefined4 uVar2;
  int iVar3;
  int iVar4;
  undefined4 uVar5;
  undefined4 uVar9;
  int *piVar6;
  void *pvVar7;
  Allocator *pAVar8;
  ulong uVar10;
  int iVar11;
  uint uVar12;
  uint uVar13;
  Layer *pLVar14;
  undefined1 auVar15 [16];
  ParamDict pd;
  Mat local_68;
  
  if ((this->super_ConvolutionDepthWise).dynamic_weight != 0) {
    return 0;
  }
  switch((this->super_ConvolutionDepthWise).activation_type) {
  case 1:
    pLVar14 = create_layer_cpu(0x1a);
    ParamDict::ParamDict((ParamDict *)&local_68);
    (*pLVar14->_vptr_Layer[2])(pLVar14,&local_68);
    break;
  case 2:
    pLVar14 = create_layer_cpu(0x1a);
    ParamDict::ParamDict((ParamDict *)&local_68);
    ParamDict::set((ParamDict *)&local_68,0,
                   *(this->super_ConvolutionDepthWise).activation_params.data);
    (*pLVar14->_vptr_Layer[2])(pLVar14,&local_68);
    break;
  case 3:
    pLVar14 = create_layer_cpu(0x36);
    ParamDict::ParamDict((ParamDict *)&local_68);
    ParamDict::set((ParamDict *)&local_68,0,
                   *(this->super_ConvolutionDepthWise).activation_params.data);
    ParamDict::set((ParamDict *)&local_68,1,
                   *(float *)((long)(this->super_ConvolutionDepthWise).activation_params.data + 4));
    (*pLVar14->_vptr_Layer[2])(pLVar14,&local_68);
    break;
  case 4:
    pLVar14 = create_layer_cpu(0x1e);
    ParamDict::ParamDict((ParamDict *)&local_68);
    (*pLVar14->_vptr_Layer[2])(pLVar14,&local_68);
    break;
  case 5:
    pLVar14 = create_layer_cpu(0x47);
    ParamDict::ParamDict((ParamDict *)&local_68);
    (*pLVar14->_vptr_Layer[2])(pLVar14,&local_68);
    break;
  case 6:
    pLVar14 = create_layer_cpu(0x43);
    ParamDict::ParamDict((ParamDict *)&local_68);
    ParamDict::set((ParamDict *)&local_68,0,
                   *(this->super_ConvolutionDepthWise).activation_params.data);
    ParamDict::set((ParamDict *)&local_68,1,
                   *(float *)((long)(this->super_ConvolutionDepthWise).activation_params.data + 4));
    (*pLVar14->_vptr_Layer[2])(pLVar14,&local_68);
    break;
  default:
    pLVar14 = (Layer *)0x0;
    goto LAB_003d8cc8;
  }
  ParamDict::~ParamDict((ParamDict *)&local_68);
  (*pLVar14->_vptr_Layer[4])(pLVar14,opt);
LAB_003d8cc8:
  this->activation = pLVar14;
  if ((opt->use_int8_inference == true) &&
     ((this->super_ConvolutionDepthWise).weight_data.elemsize == 1)) {
    create_pipeline_int8_x86(this,opt);
    return 0;
  }
  uVar5 = (this->super_ConvolutionDepthWise).kernel_w;
  uVar9 = (this->super_ConvolutionDepthWise).kernel_h;
  uVar13 = (this->super_ConvolutionDepthWise).group;
  uVar10 = (long)(this->super_ConvolutionDepthWise).weight_data_size / (long)(int)uVar13;
  uVar10 = (long)((ulong)(uint)((int)uVar10 >> 0x1f) << 0x20 | uVar10 & 0xffffffff) /
           (long)(int)(uVar9 * uVar5);
  uVar12 = (this->super_ConvolutionDepthWise).num_output;
  if ((uVar13 == uVar12) &&
     (uVar12 = (int)((long)((ulong)(uint)((int)uVar10 >> 0x1f) << 0x20 | uVar10 & 0xffffffff) /
                    (long)((int)uVar12 / (int)uVar13)) * uVar13, uVar12 == uVar13)) {
    if (((uVar13 & 3) == 0) && (opt->use_packing_layout != false)) {
      Mat::reshape(&local_68,&(this->super_ConvolutionDepthWise).weight_data,uVar9 * uVar5,uVar13,
                   (Allocator *)0x0);
      convert_packing(&local_68,&this->weight_data_tm,4,opt);
      if (local_68.refcount != (int *)0x0) {
        LOCK();
        *local_68.refcount = *local_68.refcount + -1;
        UNLOCK();
        if (*local_68.refcount == 0) {
          if (local_68.allocator == (Allocator *)0x0) {
            if (local_68.data != (void *)0x0) {
              free(local_68.data);
            }
          }
          else {
            (*(local_68.allocator)->_vptr_Allocator[3])();
          }
        }
      }
      goto LAB_003d8ecf;
    }
    uVar1 = (this->super_ConvolutionDepthWise).dilation_w;
    uVar2 = (this->super_ConvolutionDepthWise).dilation_h;
    auVar15._0_4_ = -(uint)(uVar5 == 3);
    auVar15._4_4_ = -(uint)(uVar9 == 3);
    auVar15._8_4_ = -(uint)(uVar1 == 1);
    auVar15._12_4_ = -(uint)(uVar2 == 1);
    uVar13 = movmskps(uVar12,auVar15);
    iVar3 = (this->super_ConvolutionDepthWise).stride_w;
    iVar4 = (this->super_ConvolutionDepthWise).stride_h;
    if ((iVar4 == 1 && (iVar3 == 1 && (uVar13 ^ 0xf) == 0)) ||
       ((iVar4 == 2 && iVar3 == 2) && (char)(uVar13 ^ 0xf) == '\0')) {
      piVar6 = (this->super_ConvolutionDepthWise).weight_data.refcount;
      if (piVar6 != (int *)0x0) {
        LOCK();
        *piVar6 = *piVar6 + 1;
        UNLOCK();
      }
      piVar6 = (this->weight_data_tm).refcount;
      if (piVar6 != (int *)0x0) {
        LOCK();
        *piVar6 = *piVar6 + -1;
        UNLOCK();
        if (*piVar6 == 0) {
          pvVar7 = (this->weight_data_tm).data;
          pAVar8 = (this->weight_data_tm).allocator;
          if (pAVar8 == (Allocator *)0x0) {
            if (pvVar7 != (void *)0x0) {
              free(pvVar7);
            }
          }
          else {
            (*pAVar8->_vptr_Allocator[3])();
          }
        }
      }
      piVar6 = (this->super_ConvolutionDepthWise).weight_data.refcount;
      (this->weight_data_tm).data = (this->super_ConvolutionDepthWise).weight_data.data;
      (this->weight_data_tm).refcount = piVar6;
      (this->weight_data_tm).elemsize = (this->super_ConvolutionDepthWise).weight_data.elemsize;
      (this->weight_data_tm).elempack = (this->super_ConvolutionDepthWise).weight_data.elempack;
      (this->weight_data_tm).allocator = (this->super_ConvolutionDepthWise).weight_data.allocator;
      iVar3 = (this->super_ConvolutionDepthWise).weight_data.w;
      iVar4 = (this->super_ConvolutionDepthWise).weight_data.h;
      iVar11 = (this->super_ConvolutionDepthWise).weight_data.d;
      (this->weight_data_tm).dims = (this->super_ConvolutionDepthWise).weight_data.dims;
      (this->weight_data_tm).w = iVar3;
      (this->weight_data_tm).h = iVar4;
      (this->weight_data_tm).d = iVar11;
      (this->weight_data_tm).c = (this->super_ConvolutionDepthWise).weight_data.c;
      (this->weight_data_tm).cstep = (this->super_ConvolutionDepthWise).weight_data.cstep;
      goto LAB_003d8ecf;
    }
  }
  create_group_ops(this,opt);
LAB_003d8ecf:
  if (opt->lightmode == true) {
    piVar6 = (this->super_ConvolutionDepthWise).weight_data.refcount;
    if (piVar6 != (int *)0x0) {
      LOCK();
      *piVar6 = *piVar6 + -1;
      UNLOCK();
      if (*piVar6 == 0) {
        pvVar7 = (this->super_ConvolutionDepthWise).weight_data.data;
        pAVar8 = (this->super_ConvolutionDepthWise).weight_data.allocator;
        if (pAVar8 == (Allocator *)0x0) {
          if (pvVar7 != (void *)0x0) {
            free(pvVar7);
          }
        }
        else {
          (*pAVar8->_vptr_Allocator[3])();
        }
      }
    }
    (this->super_ConvolutionDepthWise).weight_data.cstep = 0;
    *(undefined8 *)((long)&(this->super_ConvolutionDepthWise).weight_data.refcount + 4) = 0;
    *(undefined8 *)((long)&(this->super_ConvolutionDepthWise).weight_data.elemsize + 4) = 0;
    (this->super_ConvolutionDepthWise).weight_data.data = (void *)0x0;
    (this->super_ConvolutionDepthWise).weight_data.refcount = (int *)0x0;
    (this->super_ConvolutionDepthWise).weight_data.dims = 0;
    (this->super_ConvolutionDepthWise).weight_data.w = 0;
    (this->super_ConvolutionDepthWise).weight_data.h = 0;
    (this->super_ConvolutionDepthWise).weight_data.d = 0;
    (this->super_ConvolutionDepthWise).weight_data.c = 0;
  }
  return 0;
}

Assistant:

int ConvolutionDepthWise_x86::create_pipeline(const Option& opt)
{
    if (dynamic_weight)
        return 0;

    activation = create_activation_layer(activation_type, activation_params, opt);

#if NCNN_INT8
    if (opt.use_int8_inference && weight_data.elemsize == (size_t)1u)
    {
        return create_pipeline_int8_x86(opt);
    }
#endif

    const int maxk = kernel_w * kernel_h;
    int channels = (weight_data_size / group) / maxk / (num_output / group) * group;

    // depth-wise
    if (channels == group && group == num_output)
    {
        int elempack = 1;
#if __SSE2__
        if (opt.use_packing_layout)
        {
#if __AVX512F__
            elempack = channels % 16 == 0 ? 16 : channels % 8 == 0 ? 8 : channels % 4 == 0 ? 4 : 1;
#elif __AVX__
            elempack = channels % 8 == 0 ? 8 : channels % 4 == 0 ? 4 : 1;
#else
            elempack = channels % 4 == 0 ? 4 : 1;
#endif
        }
#endif // __SSE2__

#if __SSE2__
#if __AVX__
        // pack16
#if __AVX512F__
        if (elempack == 16)
        {
            Mat weight_data_r2 = weight_data.reshape(maxk, group);
            convert_packing(weight_data_r2, weight_data_tm, 16, opt);
        }
#endif // __AVX512F__

        // pack8
        if (elempack == 8)
        {
            Mat weight_data_r2 = weight_data.reshape(maxk, group);
            convert_packing(weight_data_r2, weight_data_tm, 8, opt);
        }
#endif // __AVX__

        // pack4
        if (elempack == 4)
        {
            Mat weight_data_r2 = weight_data.reshape(maxk, group);
            convert_packing(weight_data_r2, weight_data_tm, 4, opt);
        }
#endif // __SSE2__

        if (elempack == 1)
        {
            // depth-wise specific
            if (kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
            {
                weight_data_tm = weight_data;
            }
            else if (kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 2 && stride_h == 2)
            {
                weight_data_tm = weight_data;
            }
            else
            {
                create_group_ops(opt);
            }
        }

        if (opt.lightmode)
            weight_data.release();

        return 0;
    }

    // group convolution
    create_group_ops(opt);

    if (opt.lightmode)
        weight_data.release();

    return 0;
}